

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O1

DdNode * Llb_DriverPhaseCube(Aig_Man_t *pAig,Vec_Int_t *vDriRefs,DdManager *dd)

{
  abctime aVar1;
  ulong uVar2;
  uint uVar3;
  DdNode *pDVar4;
  int iVar5;
  int i;
  DdNode *f;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  pDVar4 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar4);
  if (0 < pAig->nRegs) {
    iVar5 = 0;
    f = pDVar4;
    do {
      uVar3 = pAig->nTruePos + iVar5;
      if (((int)uVar3 < 0) || (pAig->vCos->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar2 = *(ulong *)((long)pAig->vCos->pArray[uVar3] + 8);
      if (uVar2 == 0) {
        uVar3 = 0xffffffff;
      }
      else {
        uVar3 = *(uint *)((uVar2 & 0xfffffffffffffffe) + 0x24);
      }
      if (((int)uVar3 < 0) || (vDriRefs->nSize <= (int)uVar3)) {
LAB_00820dba:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vDriRefs->pArray[uVar3] < 1) {
        __assert_fail("Vec_IntEntry( vDriRefs, Aig_ObjFaninId0(pObj) ) >= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Driver.c"
                      ,0x8a,"DdNode *Llb_DriverPhaseCube(Aig_Man_t *, Vec_Int_t *, DdManager *)");
      }
      if (uVar2 == 0) {
        uVar3 = 0xffffffff;
      }
      else {
        uVar3 = *(uint *)((uVar2 & 0xfffffffffffffffe) + 0x24);
      }
      if (((int)uVar3 < 0) || (vDriRefs->nSize <= (int)uVar3)) goto LAB_00820dba;
      pDVar4 = f;
      if ((vDriRefs->pArray[uVar3] == 1) && ((uVar2 & 1) != 0)) {
        if (uVar2 == 0) {
          i = -1;
        }
        else {
          i = *(int *)((uVar2 & 0xfffffffffffffffe) + 0x24);
        }
        pDVar4 = Cudd_bddIthVar(dd,i);
        pDVar4 = Cudd_bddAnd(dd,f,pDVar4);
        Cudd_Ref(pDVar4);
        Cudd_RecursiveDeref(dd,f);
      }
      iVar5 = iVar5 + 1;
      f = pDVar4;
    } while (iVar5 < pAig->nRegs);
  }
  Cudd_Deref(pDVar4);
  dd->TimeStop = aVar1;
  return pDVar4;
}

Assistant:

DdNode * Llb_DriverPhaseCube( Aig_Man_t * pAig, Vec_Int_t * vDriRefs, DdManager * dd )
{
    DdNode * bCube, * bVar, * bTemp;
    Aig_Obj_t * pObj;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    bCube = Cudd_ReadOne( dd );  Cudd_Ref( bCube );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        assert( Vec_IntEntry( vDriRefs, Aig_ObjFaninId0(pObj) ) >= 1 );
        if ( Vec_IntEntry( vDriRefs, Aig_ObjFaninId0(pObj) ) != 1 )
            continue;
        if ( !Aig_ObjFaninC0(pObj) )
            continue;
        bVar  = Cudd_bddIthVar( dd, Aig_ObjFaninId0(pObj) );
        bCube = Cudd_bddAnd( dd, bTemp = bCube, bVar );  Cudd_Ref( bCube );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bCube );
    dd->TimeStop = TimeStop;
    return bCube;
}